

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::ShaderAtomicXorCase::getInputs
          (ShaderAtomicXorCase *this,int numValues,int stride,void *inputs)

{
  bool bVar1;
  deUint32 dVar2;
  uint uVar3;
  char *str;
  undefined4 uVar4;
  int local_54;
  int localNdx;
  int groupOffset;
  int groupNdx;
  int numWorkGroups;
  undefined1 local_30 [4];
  int workGroupSize;
  Random rnd;
  void *inputs_local;
  int stride_local;
  int numValues_local;
  ShaderAtomicXorCase *this_local;
  
  rnd.m_rnd._8_8_ = inputs;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  de::Random::Random((Random *)local_30,dVar2);
  uVar3 = product<unsigned_int,3>(&(this->super_ShaderAtomicOpCase).m_workGroupSize);
  for (localNdx = 0; localNdx < numValues / (int)uVar3; localNdx = localNdx + 1) {
    dVar2 = de::Random::getUint32((Random *)local_30);
    *(deUint32 *)(rnd.m_rnd._8_8_ + (long)(int)(stride * localNdx * uVar3)) = dVar2;
    for (local_54 = 1; local_54 < (int)uVar3; local_54 = local_54 + 1) {
      bVar1 = de::Random::getBool((Random *)local_30);
      uVar4 = 0;
      if (bVar1) {
        uVar4 = 0xffffffff;
      }
      *(undefined4 *)(rnd.m_rnd._8_8_ + (long)(int)(stride * (localNdx * uVar3 + local_54))) = uVar4
      ;
    }
  }
  de::Random::~Random((Random *)local_30);
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		de::Random		rnd				(deStringHash(getName()));
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int groupOffset = groupNdx*workGroupSize;

			// First uses random bit-pattern.
			*(deUint32*)((deUint8*)inputs + stride*(groupOffset)) = rnd.getUint32();

			// Rest have either all or no bits set.
			for (int localNdx = 1; localNdx < workGroupSize; localNdx++)
				*(deUint32*)((deUint8*)inputs + stride*(groupOffset+localNdx)) = rnd.getBool() ? ~0u : 0u;
		}
	}